

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O0

bool __thiscall
crnlib::crn_comp::pack_color_selectors
          (crn_comp *this,vector<unsigned_char> *packed_data,vector<unsigned_short> *remapping)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  unsigned_short *puVar4;
  vector<unsigned_char> *other;
  uint local_148;
  uint local_144;
  uint32 i_2;
  uint32 prev_selector_1;
  uint32 selector_1;
  uint32 c_1;
  symbol_codec codec;
  static_huffman_data_model dm;
  uint32 i_1;
  uint32 prev_selector;
  uint32 selector;
  uint32 c;
  symbol_histogram hist;
  uint local_34;
  undefined1 local_30 [4];
  uint i;
  vector<unsigned_int> remapped_selectors;
  vector<unsigned_short> *remapping_local;
  vector<unsigned_char> *packed_data_local;
  crn_comp *this_local;
  
  remapped_selectors._8_8_ = remapping;
  uVar2 = vector<unsigned_int>::size(&this->m_color_selectors);
  vector<unsigned_int>::vector((vector<unsigned_int> *)local_30,uVar2);
  local_34 = 0;
  while( true ) {
    uVar2 = vector<unsigned_int>::size(&this->m_color_selectors);
    if (uVar2 <= local_34) break;
    puVar3 = vector<unsigned_int>::operator[](&this->m_color_selectors,local_34);
    uVar1 = *puVar3;
    puVar4 = vector<unsigned_short>::operator[]
                       ((vector<unsigned_short> *)remapped_selectors._8_8_,local_34);
    puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_30,(uint)*puVar4);
    *puVar3 = uVar1;
    local_34 = local_34 + 1;
  }
  symbol_histogram::symbol_histogram((symbol_histogram *)&selector,0x10);
  dm._52_4_ = 0;
  dm.m_encoding = false;
  dm._49_3_ = 0;
  while( true ) {
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)local_30);
    if (uVar2 <= (uint)dm._48_4_) break;
    puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_30,dm._48_4_);
    uVar1 = *puVar3;
    i_1 = dm._52_4_ ^ uVar1;
    for (prev_selector = 8; prev_selector != 0; prev_selector = prev_selector - 1) {
      symbol_histogram::inc_freq((symbol_histogram *)&selector,i_1 & 0xf,1);
      i_1 = i_1 >> 4;
    }
    dm._48_4_ = dm._48_4_ + 1;
    dm._52_4_ = uVar1;
  }
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)&codec.m_support_arith);
  static_huffman_data_model::init
            ((static_huffman_data_model *)&codec.m_support_arith,(EVP_PKEY_CTX *)0x1);
  symbol_codec::symbol_codec((symbol_codec *)&selector_1);
  symbol_codec::start_encoding((symbol_codec *)&selector_1,0x100000);
  symbol_codec::encode_transmit_static_huffman_data_model
            ((symbol_codec *)&selector_1,(static_huffman_data_model *)&codec.m_support_arith,false,
             (static_huffman_data_model *)0x0);
  local_144 = 0;
  local_148 = 0;
  while( true ) {
    uVar2 = vector<unsigned_int>::size((vector<unsigned_int> *)local_30);
    if (uVar2 <= local_148) break;
    puVar3 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)local_30,local_148);
    uVar1 = *puVar3;
    i_2 = local_144 ^ uVar1;
    for (prev_selector_1 = 8; prev_selector_1 != 0; prev_selector_1 = prev_selector_1 - 1) {
      symbol_codec::encode
                ((symbol_codec *)&selector_1,i_2 & 0xf,
                 (static_huffman_data_model *)&codec.m_support_arith);
      i_2 = i_2 >> 4;
    }
    local_148 = local_148 + 1;
    local_144 = uVar1;
  }
  symbol_codec::stop_encoding((symbol_codec *)&selector_1,false);
  other = symbol_codec::get_encoding_buf((symbol_codec *)&selector_1);
  vector<unsigned_char>::swap(packed_data,other);
  symbol_codec::~symbol_codec((symbol_codec *)&selector_1);
  static_huffman_data_model::~static_huffman_data_model
            ((static_huffman_data_model *)&codec.m_support_arith);
  symbol_histogram::~symbol_histogram((symbol_histogram *)&selector);
  vector<unsigned_int>::~vector((vector<unsigned_int> *)local_30);
  return true;
}

Assistant:

bool crn_comp::pack_color_selectors(crnlib::vector<uint8>& packed_data, const crnlib::vector<uint16>& remapping)
    {
        crnlib::vector<uint32> remapped_selectors(m_color_selectors.size());
        for (uint i = 0; i < m_color_selectors.size(); i++)
        {
            remapped_selectors[remapping[i]] = m_color_selectors[i];
        }
        symbol_histogram hist(16);
        for (uint32 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++)
        {
            for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 4)
            {
                hist.inc_freq(selector & 0xF);
            }
        }
        static_huffman_data_model dm;
        dm.init(true, hist, 15);
        symbol_codec codec;
        codec.start_encoding(1024 * 1024);
        codec.encode_transmit_static_huffman_data_model(dm, false);
        for (uint32 c, selector, prev_selector = 0, i = 0; i < remapped_selectors.size(); i++)
        {
            for (selector = prev_selector ^ remapped_selectors[i], prev_selector ^= selector, c = 8; c; c--, selector >>= 4)
            {
                codec.encode(selector & 0xF, dm);
            }
        }
        codec.stop_encoding(false);
        packed_data.swap(codec.get_encoding_buf());
        return true;
    }